

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986HierPart(xmlURIPtr uri,char **str)

{
  int iVar1;
  char *pcStack_28;
  int ret;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  pcStack_28 = *str;
  cur = (char *)str;
  str_local = &uri->scheme;
  if ((*pcStack_28 == '/') && (pcStack_28[1] == '/')) {
    pcStack_28 = pcStack_28 + 2;
    iVar1 = xmlParse3986Authority(uri,&stack0xffffffffffffffd8);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((str_local[3] == (char *)0x0) && (*(int *)(str_local + 5) == 0)) {
      *(undefined4 *)(str_local + 5) = 0xffffffff;
    }
    iVar1 = xmlParse3986PathAbEmpty((xmlURIPtr)str_local,&stack0xffffffffffffffd8);
    if (iVar1 != 0) {
      return iVar1;
    }
    *(char **)cur = pcStack_28;
    return 0;
  }
  if (*pcStack_28 == '/') {
    iVar1 = xmlParse3986PathAbsolute(uri,&stack0xffffffffffffffd8);
  }
  else {
    iVar1 = xmlIsUnreserved(uri,pcStack_28);
    if ((iVar1 == 0) &&
       ((((*pcStack_28 != '%' ||
          ((((pcStack_28[1] < '0' || ('9' < pcStack_28[1])) &&
            ((pcStack_28[1] < 'a' || ('f' < pcStack_28[1])))) &&
           ((pcStack_28[1] < 'A' || ('F' < pcStack_28[1])))))) ||
         (((pcStack_28[2] < '0' || ('9' < pcStack_28[2])) &&
          (((pcStack_28[2] < 'a' || ('f' < pcStack_28[2])) &&
           ((pcStack_28[2] < 'A' || ('F' < pcStack_28[2])))))))) &&
        ((((*pcStack_28 != '!' && (*pcStack_28 != '$')) && (*pcStack_28 != '&')) &&
         ((((*pcStack_28 != '(' && (*pcStack_28 != ')')) &&
           ((*pcStack_28 != '*' &&
            (((*pcStack_28 != '+' && (*pcStack_28 != ',')) &&
             ((*pcStack_28 != ';' &&
              (((*pcStack_28 != '=' && (*pcStack_28 != '\'')) && (*pcStack_28 != ':')))))))))) &&
          (*pcStack_28 != '@')))))))) {
      if (str_local != (char **)0x0) {
        if (str_local[6] != (char *)0x0) {
          (*xmlFree)(str_local[6]);
        }
        str_local[6] = (char *)0x0;
      }
      goto LAB_0017255b;
    }
    iVar1 = xmlParse3986PathRootless((xmlURIPtr)str_local,&stack0xffffffffffffffd8);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_0017255b:
  *(char **)cur = pcStack_28;
  return 0;
}

Assistant:

static int
xmlParse3986HierPart(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;

    if ((*cur == '/') && (*(cur + 1) == '/')) {
        cur += 2;
	ret = xmlParse3986Authority(uri, &cur);
	if (ret != 0) return(ret);
        /*
         * An empty server is marked with a special URI value.
         */
	if ((uri->server == NULL) && (uri->port == PORT_EMPTY))
	    uri->port = PORT_EMPTY_SERVER;
	ret = xmlParse3986PathAbEmpty(uri, &cur);
	if (ret != 0) return(ret);
	*str = cur;
	return(0);
    } else if (*cur == '/') {
        ret = xmlParse3986PathAbsolute(uri, &cur);
	if (ret != 0) return(ret);
    } else if (ISA_PCHAR(uri, cur)) {
        ret = xmlParse3986PathRootless(uri, &cur);
	if (ret != 0) return(ret);
    } else {
	/* path-empty is effectively empty */
	if (uri != NULL) {
	    if (uri->path != NULL) xmlFree(uri->path);
	    uri->path = NULL;
	}
    }
    *str = cur;
    return (0);
}